

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_function.cpp
# Opt level: O1

char * prototype_string(glsl_type *return_type,char *name,exec_list *parameters)

{
  exec_node *peVar1;
  char *pcVar2;
  char *str;
  char *local_28;
  
  local_28 = (char *)0x0;
  if (return_type != (glsl_type *)0x0) {
    local_28 = ralloc_asprintf((void *)0x0,"%s ",return_type->name);
  }
  ralloc_asprintf_append(&local_28,"%s(",name);
  peVar1 = (parameters->head_sentinel).next;
  if (peVar1->next != (exec_node *)0x0) {
    pcVar2 = "";
    do {
      ralloc_asprintf_append(&local_28,"%s%s",pcVar2,peVar1[1].prev[1].next);
      peVar1 = peVar1->next;
      pcVar2 = ", ";
    } while (peVar1->next != (exec_node *)0x0);
  }
  ralloc_strcat(&local_28,")");
  return local_28;
}

Assistant:

char *
prototype_string(const glsl_type *return_type, const char *name,
                 exec_list *parameters)
{
   char *str = NULL;

   if (return_type != NULL)
      str = ralloc_asprintf(NULL, "%s ", return_type->name);

   ralloc_asprintf_append(&str, "%s(", name);

   const char *comma = "";
   foreach_in_list(const ir_variable, param, parameters) {
      ralloc_asprintf_append(&str, "%s%s", comma, param->type->name);
      comma = ", ";
   }

   ralloc_strcat(&str, ")");
   return str;
}